

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmintegration.cpp
# Opt level: O3

QKmsDevice * __thiscall QEglFSKmsGbmIntegration::createDevice(QEglFSKmsGbmIntegration *this)

{
  QDebug QVar1;
  long lVar2;
  QDeviceDiscovery *pQVar3;
  QEglFSKmsGbmDevice *this_00;
  QKmsScreenConfig *screenConfig;
  char16_t *pcVar4;
  QTextStream *pQVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebug local_b0;
  QDebug local_a8;
  QtPrivate local_a0 [8];
  QArrayDataPointer<QString> local_98;
  QEglFSKmsGbmIntegration local_80;
  undefined8 local_68;
  QString local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = QEglFSKmsIntegration::screenConfig();
  local_60.d.d = *(Data **)(lVar2 + 8);
  local_60.d.ptr = *(char16_t **)(lVar2 + 0x10);
  local_60.d.size = *(long *)(lVar2 + 0x18);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_60.d.size == 0) {
    pQVar3 = QDeviceDiscovery::create((QDeviceTypes)0x10,(QObject *)0x0);
    local_98.size = -0x5555555555555556;
    local_98.d._0_4_ = 0xaaaaaaaa;
    local_98.d._4_4_ = 0xaaaaaaaa;
    local_98.ptr._0_4_ = 0xaaaaaaaa;
    local_98.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)pQVar3 + 0x60))(&local_98,pQVar3);
    lVar2 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
      local_68 = *(undefined8 *)(lVar2 + 8);
      local_80.super_QEglFSKmsIntegration = (QEglFSKmsIntegration)0x2;
      local_80._1_3_ = 0;
      local_80._4_8_ = 0;
      local_80._12_8_ = 0;
      local_80._20_4_ = 0;
      QMessageLogger::debug();
      QVar1.stream = local_b0.stream;
      QVar8.m_data = (storage_type *)0x22;
      QVar8.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)QVar1.stream,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_b0.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
      }
      *(int *)(local_b0.stream + 0x28) = *(int *)(local_b0.stream + 0x28) + 1;
      local_a8.stream = (Stream *)0x0;
      local_48.d.d = (Data *)local_b0.stream;
      QtPrivate::printSequentialContainer<QList<QString>>
                (local_a0,(Stream *)&local_48,"QList",(QList<QString> *)&local_98);
      QDebug::~QDebug((QDebug *)&local_48);
      QDebug::~QDebug((QDebug *)local_a0);
      QDebug::~QDebug(&local_a8);
      QDebug::~QDebug(&local_b0);
    }
    QObject::deleteLater();
    if (local_98.size == 0) {
      createDevice(&local_80);
      goto LAB_001125d2;
    }
    QString::operator=(&local_60,(QString *)CONCAT44(local_98.ptr._4_4_,local_98.ptr._0_4_));
    lVar2 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
      local_68 = *(undefined8 *)(lVar2 + 8);
      local_80.super_QEglFSKmsIntegration = (QEglFSKmsIntegration)0x2;
      local_80._1_3_ = 0;
      local_80._4_8_ = 0;
      local_80._12_8_ = 0;
      local_80._20_4_ = 0;
      QMessageLogger::debug();
      QVar1.stream = local_b0.stream;
      QVar9.m_data = (storage_type *)0x5;
      QVar9.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<((QTextStream *)QVar1.stream,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_b0.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
      }
      pcVar4 = local_60.d.ptr;
      if (local_60.d.ptr == (char16_t *)0x0) {
        pcVar4 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_b0,(ulong)pcVar4);
      if ((char)(((QArrayData *)(local_b0.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
      }
      QDebug::~QDebug(&local_b0);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  }
  else {
    lVar2 = QtPrivateLogging::qLcEglfsKmsDebug();
    if ((*(byte *)(lVar2 + 0x10) & 1) != 0) {
      local_68 = *(undefined8 *)(lVar2 + 8);
      local_80.super_QEglFSKmsIntegration = (QEglFSKmsIntegration)0x2;
      local_80._1_3_ = 0;
      local_80._4_8_ = 0;
      local_80._12_8_ = 0;
      local_80._20_4_ = 0;
      QMessageLogger::debug();
      pQVar5 = (QTextStream *)CONCAT44(local_98.d._4_4_,local_98.d._0_4_);
      QVar6.m_data = (storage_type *)0x15;
      QVar6.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar6);
      QTextStream::operator<<(pQVar5,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((QTextStream *)CONCAT44(local_98.d._4_4_,local_98.d._0_4_))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT44(local_98.d._4_4_,local_98.d._0_4_),' ');
      }
      pcVar4 = local_60.d.ptr;
      if (local_60.d.ptr == (char16_t *)0x0) {
        pcVar4 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_98,(ulong)pcVar4);
      pQVar5 = (QTextStream *)CONCAT44(local_98.d._4_4_,local_98.d._0_4_);
      if (pQVar5[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(pQVar5,' ');
        pQVar5 = (QTextStream *)CONCAT44(local_98.d._4_4_,local_98.d._0_4_);
      }
      QVar7.m_data = (storage_type *)0x18;
      QVar7.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<(pQVar5,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (((QTextStream *)CONCAT44(local_98.d._4_4_,local_98.d._0_4_))[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)CONCAT44(local_98.d._4_4_,local_98.d._0_4_),' ');
      }
      QDebug::~QDebug((QDebug *)&local_98);
    }
  }
  this_00 = (QEglFSKmsGbmDevice *)operator_new(0x70);
  screenConfig = (QKmsScreenConfig *)QEglFSKmsIntegration::screenConfig();
  QEglFSKmsGbmDevice::QEglFSKmsGbmDevice(this_00,screenConfig,&local_60);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QKmsDevice *)this_00;
  }
LAB_001125d2:
  __stack_chk_fail();
}

Assistant:

QKmsDevice *QEglFSKmsGbmIntegration::createDevice()
{
    QString path = screenConfig()->devicePath();
    if (!path.isEmpty()) {
        qCDebug(qLcEglfsKmsDebug) << "GBM: Using DRM device" << path << "specified in config file";
    } else {
        QDeviceDiscovery *d = QDeviceDiscovery::create(QDeviceDiscovery::Device_VideoMask);
        const QStringList devices = d->scanConnectedDevices();
        qCDebug(qLcEglfsKmsDebug) << "Found the following video devices:" << devices;
        d->deleteLater();

        if (Q_UNLIKELY(devices.isEmpty()))
            qFatal("Could not find DRM device!");

        path = devices.first();
        qCDebug(qLcEglfsKmsDebug) << "Using" << path;
    }

    return new QEglFSKmsGbmDevice(screenConfig(), path);
}